

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O2

void google::AddLogSink(LogSink *destination)

{
  LogSink *pLStack_10;
  
  pLStack_10 = destination;
  ::glog_internal_namespace_::Mutex::Lock((Mutex *)LogDestination::sink_mutex_);
  if (LogDestination::sinks_ == (vector<google::LogSink_*,_std::allocator<google::LogSink_*>_> *)0x0
     ) {
    LogDestination::sinks_ =
         (vector<google::LogSink_*,_std::allocator<google::LogSink_*>_> *)operator_new(0x18);
    (LogDestination::sinks_->
    super__Vector_base<google::LogSink_*,_std::allocator<google::LogSink_*>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (LogDestination::sinks_->
    super__Vector_base<google::LogSink_*,_std::allocator<google::LogSink_*>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (LogDestination::sinks_->
    super__Vector_base<google::LogSink_*,_std::allocator<google::LogSink_*>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  std::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>::push_back
            (LogDestination::sinks_,&pLStack_10);
  ::glog_internal_namespace_::Mutex::Unlock((Mutex *)LogDestination::sink_mutex_);
  return;
}

Assistant:

void AddLogSink(LogSink *destination) {
  LogDestination::AddLogSink(destination);
}